

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O1

PrimInfo * __thiscall
embree::avx::PointsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,PointsISA *this,mvector<PrimRef> *prims,size_t itime,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  ulong uVar1;
  RawBufferView *pRVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  PrimRef *pPVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  undefined4 uVar11;
  size_t sVar12;
  long lVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  size_t *psVar17;
  ulong uVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  undefined1 auVar24 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar20 [64];
  undefined1 auVar22 [64];
  
  aVar19.m128[2] = INFINITY;
  aVar19._0_8_ = 0x7f8000007f800000;
  aVar19.m128[3] = INFINITY;
  auVar20 = ZEXT1664((undefined1  [16])aVar19);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar19;
  aVar21.m128[2] = -INFINITY;
  aVar21._0_8_ = 0xff800000ff800000;
  aVar21.m128[3] = -INFINITY;
  auVar22 = ZEXT1664((undefined1  [16])aVar21);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar21;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar19;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar21;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar15 = r->_begin;
  sVar14 = __return_storage_ptr__->end;
  aVar25 = aVar19;
  aVar23 = aVar21;
  if (uVar15 < r->_end) {
    uVar1 = itime + 1;
    auVar27._8_4_ = 0x7f800000;
    auVar27._0_8_ = 0x7f8000007f800000;
    auVar27._12_4_ = 0x7f800000;
    auVar28._8_4_ = 0xff800000;
    auVar28._0_8_ = 0xff800000ff800000;
    auVar28._12_4_ = 0xff800000;
    auVar29._8_4_ = 0xddccb9a2;
    auVar29._0_8_ = 0xddccb9a2ddccb9a2;
    auVar29._12_4_ = 0xddccb9a2;
    auVar30._8_4_ = 0x5dccb9a2;
    auVar30._0_8_ = 0x5dccb9a25dccb9a2;
    auVar30._12_4_ = 0x5dccb9a2;
    auVar26 = ZEXT1664((undefined1  [16])aVar19);
    auVar24 = ZEXT1664((undefined1  [16])aVar21);
    do {
      uVar16 = uVar15 & 0xffffffff;
      pBVar3 = (this->super_Points).vertices.items;
      uVar18 = (pBVar3->super_RawBufferView).num;
      auVar31 = auVar28;
      auVar32 = auVar27;
      if (uVar16 < uVar18) {
        pcVar4 = pBVar3[itime].super_RawBufferView.ptr_ofs;
        lVar13 = pBVar3[itime].super_RawBufferView.stride * uVar16;
        bVar7 = false;
        if (0.0 <= *(float *)(pcVar4 + lVar13 + 0xc)) {
          auVar33 = *(undefined1 (*) [16])(pcVar4 + lVar13);
          auVar8 = vcmpps_avx(auVar33,auVar29,2);
          auVar33 = vcmpps_avx(auVar33,auVar30,5);
          auVar33 = vorps_avx(auVar8,auVar33);
          uVar11 = vmovmskps_avx(auVar33);
          if ((char)uVar11 == '\0') {
            psVar17 = &pBVar3[itime + 1].super_RawBufferView.stride;
            sVar12 = itime;
            do {
              sVar12 = sVar12 + 1;
              bVar7 = itime < sVar12;
              if (itime < sVar12) {
                if (uVar16 < uVar18) goto LAB_013296d3;
                goto LAB_013297b2;
              }
              pRVar2 = (RawBufferView *)(psVar17 + -2);
              sVar5 = *psVar17;
              if (*(float *)(pRVar2->ptr_ofs + sVar5 * uVar16 + 0xc) < 0.0) break;
              psVar17 = psVar17 + 7;
              auVar33 = *(undefined1 (*) [16])(pRVar2->ptr_ofs + sVar5 * uVar16);
              auVar8 = vcmpps_avx(auVar33,auVar29,2);
              auVar33 = vcmpps_avx(auVar33,auVar30,5);
              auVar33 = vorps_avx(auVar8,auVar33);
              uVar11 = vmovmskps_avx(auVar33);
            } while ((char)uVar11 == '\0');
          }
        }
        if (!(bool)(uVar16 < uVar18 & bVar7)) goto LAB_013297b2;
LAB_013296d3:
        pcVar4 = pBVar3[uVar1].super_RawBufferView.ptr_ofs;
        lVar13 = pBVar3[uVar1].super_RawBufferView.stride * uVar16;
        bVar7 = false;
        if (*(float *)(pcVar4 + lVar13 + 0xc) < 0.0) goto LAB_013297b2;
        auVar33 = *(undefined1 (*) [16])(pcVar4 + lVar13);
        auVar8 = vcmpps_avx(auVar33,auVar29,2);
        auVar33 = vcmpps_avx(auVar33,auVar30,5);
        auVar33 = vorps_avx(auVar8,auVar33);
        uVar11 = vmovmskps_avx(auVar33);
        if ((char)uVar11 == '\0') {
          psVar17 = &pBVar3[itime + 2].super_RawBufferView.stride;
          uVar18 = uVar1;
          do {
            uVar18 = uVar18 + 1;
            if (uVar1 < uVar18) goto LAB_01329772;
            pRVar2 = (RawBufferView *)(psVar17 + -2);
            sVar12 = *psVar17;
            if (*(float *)(pRVar2->ptr_ofs + sVar12 * uVar16 + 0xc) < 0.0) break;
            psVar17 = psVar17 + 7;
            auVar33 = *(undefined1 (*) [16])(pRVar2->ptr_ofs + sVar12 * uVar16);
            auVar8 = vcmpps_avx(auVar33,auVar29,2);
            auVar33 = vcmpps_avx(auVar33,auVar30,5);
            auVar33 = vorps_avx(auVar8,auVar33);
            uVar11 = vmovmskps_avx(auVar33);
          } while ((char)uVar11 == '\0');
          if (uVar18 <= uVar1) goto LAB_013297b2;
LAB_01329772:
          pcVar4 = pBVar3[itime].super_RawBufferView.ptr_ofs;
          lVar13 = pBVar3[itime].super_RawBufferView.stride * uVar15;
          auVar33 = *(undefined1 (*) [16])(pcVar4 + lVar13);
          auVar32 = ZEXT416((uint)(*(float *)(pcVar4 + lVar13 + 0xc) *
                                  (this->super_Points).maxRadiusScale));
          auVar8 = vshufps_avx(auVar32,auVar32,0);
          auVar32 = vsubps_avx(auVar33,auVar8);
          auVar31._0_4_ = auVar33._0_4_ + auVar8._0_4_;
          auVar31._4_4_ = auVar33._4_4_ + auVar8._4_4_;
          auVar31._8_4_ = auVar33._8_4_ + auVar8._8_4_;
          auVar31._12_4_ = auVar33._12_4_ + auVar8._12_4_;
          bVar7 = true;
        }
      }
      else {
LAB_013297b2:
        bVar7 = false;
      }
      sVar12 = k;
      if (bVar7) {
        aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar32,ZEXT416(geomID),0x30);
        aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar31,ZEXT416((uint)uVar15),0x30);
        auVar32 = vminps_avx(auVar20._0_16_,(undefined1  [16])aVar9);
        auVar20 = ZEXT1664(auVar32);
        auVar32 = vmaxps_avx(auVar22._0_16_,(undefined1  [16])aVar10);
        auVar22 = ZEXT1664(auVar32);
        auVar33._0_4_ = aVar10.x + aVar9.x;
        auVar33._4_4_ = aVar10.y + aVar9.y;
        auVar33._8_4_ = aVar10.z + aVar9.z;
        auVar33._12_4_ = aVar10.field_3.w + aVar9.field_3.w;
        auVar32 = vminps_avx(auVar26._0_16_,auVar33);
        auVar26 = ZEXT1664(auVar32);
        auVar32 = vmaxps_avx(auVar24._0_16_,auVar33);
        auVar24 = ZEXT1664(auVar32);
        sVar14 = sVar14 + 1;
        sVar12 = k + 1;
        pPVar6 = prims->items;
        pPVar6[k].lower.field_0.field_1 = aVar9;
        pPVar6[k].upper.field_0.field_1 = aVar10;
      }
      aVar23 = auVar24._0_16_;
      aVar25 = auVar26._0_16_;
      aVar21 = auVar22._0_16_;
      aVar19 = auVar20._0_16_;
      uVar15 = uVar15 + 1;
      k = sVar12;
    } while (uVar15 < r->_end);
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar19;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar21;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar25;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar23;
  __return_storage_ptr__->end = sVar14;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(mvector<PrimRef>& prims, size_t itime, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          BBox3fa bounds = empty;
          if (!buildBounds(j, itime, bounds))
            continue;
          const PrimRef prim(bounds, geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }